

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_mb_slice_group(h264_slice *slice,uint32_t mbaddr)

{
  int y;
  int x;
  int ret;
  uint32_t mbaddr_local;
  h264_slice *slice_local;
  int local_4;
  
  if (mbaddr < slice->pic_size_in_mbs) {
    if (slice->picparm->num_slice_groups_minus1 == 0) {
      local_4 = 0;
    }
    else {
      if ((slice->seqparm->frame_mbs_only_flag == 0) && (slice->field_pic_flag == 0)) {
        if (slice->mbaff_frame_flag == 0) {
          ret = slice->sgmap[mbaddr >> 1];
        }
        else {
          ret = slice->sgmap
                [((int)(mbaddr / slice->pic_width_in_mbs) / 2) * slice->pic_width_in_mbs +
                 mbaddr % slice->pic_width_in_mbs];
        }
      }
      else {
        ret = slice->sgmap[mbaddr];
      }
      local_4 = ret;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int h264_mb_slice_group(struct h264_slice *slice, uint32_t mbaddr) {
	if (mbaddr < 0 || mbaddr >= slice->pic_size_in_mbs)
		return 0;
	if (!slice->picparm->num_slice_groups_minus1)
		return 0;
	int ret;
	if (slice->seqparm->frame_mbs_only_flag || slice->field_pic_flag) {
		ret = slice->sgmap[mbaddr];
	} else if (!slice->mbaff_frame_flag) {
		ret = slice->sgmap[mbaddr/2];
	} else {
		int x = mbaddr % slice->pic_width_in_mbs;
		int y = mbaddr / slice->pic_width_in_mbs;
		ret = slice->sgmap[y / 2 * slice->pic_width_in_mbs + x];
	}
	return ret;
}